

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

void __thiscall
llvm::optional_detail::OptionalStorage<llvm::DWARFDebugRnglistTable,_false>::reset
          (OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this)

{
  OptionalStorage<llvm::DWARFDebugRnglistTable,_false> *this_local;
  
  if ((this->hasVal & 1U) != 0) {
    DWARFDebugRnglistTable::~DWARFDebugRnglistTable((DWARFDebugRnglistTable *)this);
    this->hasVal = false;
  }
  return;
}

Assistant:

void reset() noexcept {
    if (hasVal) {
      value.~T();
      hasVal = false;
    }
  }